

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cell.c
# Opt level: O0

REF_STATUS
ref_cell_local_gem(REF_CELL ref_cell,REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_BOOL *local)

{
  REF_INT local_4c;
  REF_INT local_48;
  int local_44;
  int local_40;
  int local_3c;
  REF_INT test_node;
  REF_INT search_node;
  REF_INT cell;
  REF_INT item;
  REF_BOOL *local_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_NODE ref_node_local;
  REF_CELL ref_cell_local;
  
  *local = 0;
  if ((node0 < 0) || (ref_cell->ref_adj->nnode <= node0)) {
    local_44 = -1;
  }
  else {
    local_44 = ref_cell->ref_adj->first[node0];
  }
  search_node = local_44;
  if (local_44 == -1) {
    local_48 = -1;
  }
  else {
    local_48 = ref_cell->ref_adj->item[local_44].ref;
  }
  test_node = local_48;
  do {
    if (search_node == -1) {
      *local = 1;
      return 0;
    }
    for (local_3c = 0; local_3c < ref_cell->node_per; local_3c = local_3c + 1) {
      if (node1 == ref_cell->c2n[local_3c + ref_cell->size_per * test_node]) {
        for (local_40 = 0; local_40 < ref_cell->node_per; local_40 = local_40 + 1) {
          if (ref_node->ref_mpi->id !=
              ref_node->part[ref_cell->c2n[local_40 + ref_cell->size_per * test_node]]) {
            return 0;
          }
        }
      }
    }
    search_node = ref_cell->ref_adj->item[search_node].next;
    if (search_node == -1) {
      local_4c = -1;
    }
    else {
      local_4c = ref_cell->ref_adj->item[search_node].ref;
    }
    test_node = local_4c;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cell_local_gem(REF_CELL ref_cell, REF_NODE ref_node,
                                      REF_INT node0, REF_INT node1,
                                      REF_BOOL *local) {
  REF_INT item, cell, search_node, test_node;

  *local = REF_FALSE;

  each_ref_cell_having_node(ref_cell, node0, item, cell) {
    for (search_node = 0; search_node < ref_cell_node_per(ref_cell);
         search_node++) {
      if (node1 == ref_cell_c2n(ref_cell, search_node, cell)) {
        for (test_node = 0; test_node < ref_cell_node_per(ref_cell);
             test_node++) {
          if (!ref_node_owned(ref_node,
                              ref_cell_c2n(ref_cell, test_node, cell))) {
            return REF_SUCCESS;
          }
        }
      }
    }
  }

  *local = REF_TRUE;

  return REF_SUCCESS;
}